

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void nn_sws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  void **ppvVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  uint16_t uVar6;
  int iVar7;
  long lVar8;
  size_t size;
  nn_fsm *buf;
  ulong uVar9;
  void *pvVar10;
  byte bVar11;
  uint uVar12;
  char *pcVar13;
  nn_usock *self_00;
  int *piVar14;
  ulong uVar15;
  undefined8 uVar16;
  
  uVar15 = (ulong)(uint)type;
  piVar14 = (int *)(ulong)(uint)src;
  uVar9 = (ulong)*(uint *)&self[1].fn;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_ws_handshake_start
                  ((nn_ws_handshake *)&self[1].owner,(nn_usock *)self[1].srcptr,
                   (nn_pipebase *)&self[0x3d].stopped.type,self[1].src,(char *)self[0x40].srcptr,
                   (char *)self[0x40].owner);
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      pcVar13 = "Unexpected action";
      uVar9 = 1;
      piVar14 = (int *)0xfffffffffffffffe;
      uVar16 = 0x332;
    }
    else {
      pcVar13 = "Unexpected source";
      uVar9 = 1;
      uVar16 = 0x336;
    }
    break;
  case 2:
    if (src == 2) {
      if (type == 2) {
LAB_0012932d:
        *(undefined4 *)&self[1].fn = 7;
        iVar7 = 2;
        goto LAB_0012935b;
      }
      if (type == 1) {
        nn_ws_handshake_stop((nn_ws_handshake *)&self[1].owner);
        *(undefined4 *)&self[1].fn = 3;
        return;
      }
      pcVar13 = "Unexpected action";
      uVar9 = 2;
      piVar14 = (int *)0x2;
      uVar16 = 0x353;
    }
    else {
      pcVar13 = "Unexpected source";
      uVar9 = 2;
      uVar16 = 0x357;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 3) {
        iVar7 = nn_pipebase_start((nn_pipebase *)&self[0x3d].stopped.type);
        if (-1 < iVar7) {
          nn_sws_recv_hdr((nn_sws *)self);
          self[0x44].stopped.type = 1;
          *(undefined4 *)&self[1].fn = 4;
          return;
        }
LAB_0012934b:
        *(undefined4 *)&self[1].fn = 7;
        iVar7 = 1;
LAB_0012935b:
        nn_fsm_raise(self,(nn_fsm_event *)&self[0x46].state,iVar7);
        return;
      }
      pcVar13 = "Unexpected action";
      uVar9 = 3;
      piVar14 = (int *)0x2;
      uVar16 = 0x376;
    }
    else {
      pcVar13 = "Unexpected source";
      uVar9 = 3;
      uVar16 = 0x37a;
    }
    break;
  case 4:
    if (src == 1) {
      switch(type) {
      case 3:
        if (self[0x44].stopped.type == 2) {
          self[0x44].stopped.type = 1;
          nn_msg_term((nn_msg *)&self[0x45].shutdown_fn);
          nn_msg_init((nn_msg *)&self[0x45].shutdown_fn,0);
          nn_pipebase_sent((nn_pipebase *)&self[0x3d].stopped.type);
          return;
        }
        pcVar13 = "sws->outstate == NN_SWS_OUTSTATE_SENDING";
        uVar16 = 0x388;
        goto LAB_00129908;
      case 4:
        goto switchD_00129274_caseD_4;
      case 5:
        nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
        goto LAB_0012934b;
      default:
        pcVar13 = "Unexpected action";
        uVar9 = 4;
        piVar14 = (int *)0x1;
        uVar16 = 0x576;
        goto LAB_00129c7e;
      case 8:
        nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
        *(undefined4 *)&self[1].fn = 6;
        return;
      }
    }
    pcVar13 = "Unexpected source";
    uVar9 = 4;
    uVar16 = 0x57c;
    break;
  case 5:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012934b;
      if (type == 3) {
        if (self[0x44].stopped.type != 2) {
          pcVar13 = "sws->outstate == NN_SWS_OUTSTATE_SENDING";
          uVar16 = 0x58b;
          goto LAB_00129908;
        }
        self[0x44].stopped.type = 1;
        goto LAB_0012932d;
      }
      pcVar13 = "Unexpected action";
      uVar9 = 5;
      piVar14 = (int *)0x1;
      uVar16 = 0x598;
    }
    else {
      pcVar13 = "Unexpected source";
      uVar9 = 5;
      uVar16 = 0x59c;
    }
    break;
  case 6:
    if (src == 1) {
      if (type == 5) goto LAB_0012934b;
      pcVar13 = "Unexpected action";
      uVar9 = 6;
      piVar14 = (int *)0x1;
      uVar16 = 0x5ae;
    }
    else {
      pcVar13 = "Unexpected source";
      uVar9 = 6;
      uVar16 = 0x5b2;
    }
    break;
  case 7:
    pcVar13 = "Unexpected source";
    uVar9 = 7;
    uVar16 = 0x5bb;
    break;
  default:
    pcVar13 = "Unexpected state";
    uVar16 = 0x5c1;
  }
LAB_00129c7e:
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar13,uVar9,piVar14,uVar15,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
          ,uVar16);
LAB_0012990f:
  fflush(_stderr);
  nn_err_abort();
switchD_00129274_caseD_4:
  iVar7 = *(int *)&self[0x40].ctx;
  if (iVar7 == 3) {
    if (self[0x40].stopped.field_0xc != '\0') {
      nn_sws_mask_payload((uint8_t *)self[0x41].stopped.fsm,*(size_t *)&self[0x41].stopped.src,
                          (uint8_t *)self[0x40].stopped.srcptr,0,piVar14);
    }
    switch(*(undefined1 *)((long)&self[0x40].stopped.src + 2)) {
    case 0:
      if ((self[0x41].stopped.field_0x1c & 0xf) == 1) goto switchD_00129425_caseD_1;
    case 2:
      if (*(int *)&self[0x40].stopped.item.next == 0) {
LAB_001297d4:
        nn_sws_recv_hdr((nn_sws *)self);
        return;
      }
LAB_001294da:
      *(undefined4 *)&self[0x40].ctx = 4;
LAB_00129600:
      nn_pipebase_received((nn_pipebase *)&self[0x3d].stopped.type);
      return;
    case 1:
switchD_00129425_caseD_1:
      nn_sws_validate_utf8_chunk((nn_sws *)self);
      return;
    default:
      pcVar13 = "0";
      uVar16 = 0x561;
      break;
    case 8:
      if (1 < *(ulong *)&self[0x41].stopped.src) {
LAB_00129580:
        nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
        *(undefined4 *)&self[1].fn = 5;
        return;
      }
      pcVar13 = "sws->inmsg_current_chunk_len >= NN_SWS_CLOSE_CODE_LEN";
      uVar16 = 0x559;
      break;
    case 9:
    case 10:
switchD_00129425_caseD_9:
      *(undefined4 *)&self[0x40].ctx = 5;
      goto LAB_00129600;
    }
  }
  else {
    if (iVar7 == 2) {
      if (*(long *)&self[0x40].stopped.type == 0) {
        pcVar13 = "sws->ext_hdr_len > 0";
        uVar16 = 0x4c9;
        goto LAB_00129908;
      }
      bVar2 = *(byte *)((long)&self[0x40].stopped.src + 3);
      size = (size_t)bVar2;
      if (size < 0x7e) {
        lVar8 = 0x162e;
      }
      else if (size == 0x7f) {
        size = nn_getll((uint8_t *)((long)&self[0x40].ctx + 6));
        lVar8 = 0x1636;
      }
      else {
        if (bVar2 != 0x7e) {
          pcVar13 = "Invalid payload length.";
          goto LAB_00129780;
        }
        uVar6 = nn_gets((uint8_t *)((long)&self[0x40].ctx + 6));
        size = (size_t)uVar6;
        lVar8 = 0x1630;
      }
      *(size_t *)&self[0x41].stopped.src = size;
      pvVar10 = (void *)0x0;
      if (self[0x40].stopped.field_0xc != '\0') {
        pvVar10 = (void *)((long)&self->fn + lVar8);
      }
      self[0x40].stopped.srcptr = pvVar10;
      if (size == 0) {
        if (*(int *)&self[0x40].stopped.item.next == 0) goto LAB_001297d4;
        if (*(char *)((long)&self[0x40].stopped.src + 2) == '\b') goto LAB_00129580;
        *(uint *)&self[0x40].ctx =
             5 - (uint)(*(int *)((long)&self[0x40].stopped.item.next + 4) == 0);
        goto LAB_00129600;
      }
      if (*(int *)((long)&self[0x40].stopped.item.next + 4) == 0) {
        piVar14 = &self[0x41].stopped.type;
        *piVar14 = *piVar14 + 1;
        ppvVar1 = &self[0x41].stopped.srcptr;
        *ppvVar1 = (void *)((long)*ppvVar1 + size);
        buf = (nn_fsm *)nn_msg_chunk_new(size,(nn_list *)&self[0x41].owner);
        size = *(size_t *)&self[0x41].stopped.src;
      }
      else {
        buf = (nn_fsm *)&self[0x41].stopped.field_0x1d;
      }
      self[0x41].stopped.fsm = buf;
      *(undefined4 *)&self[0x40].ctx = 3;
LAB_001295cf:
      self_00 = (nn_usock *)self[1].srcptr;
      uVar9 = size;
LAB_001295d3:
      nn_usock_recv(self_00,buf,uVar9,(int *)0x0);
      return;
    }
    if (iVar7 != 1) {
      pcVar13 = "Unexpected socket instate";
      piVar14 = (int *)0x1;
      uVar9 = 4;
      uVar15 = 4;
      uVar16 = 0x567;
      goto LAB_00129c7e;
    }
    bVar2 = *(byte *)((long)&self[0x40].ctx + 4);
    if ((bVar2 & 0x70) != 0) {
      pcVar13 = "RSV1, RSV2, and RSV3 must be unset.";
      goto LAB_00129780;
    }
    *(uint *)&self[0x40].stopped.item.next = bVar2 & 0xffffff80;
    bVar11 = *(byte *)((long)&self[0x40].ctx + 5);
    bVar5 = bVar11 & 0x80;
    self[0x40].stopped.field_0xc = bVar5;
    iVar7 = self[1].src;
    if (iVar7 == 1) {
      if (bVar5 != 0) {
        pcVar13 = "Client expects MASK bit to be unset.";
        goto LAB_00129780;
      }
      uVar9 = 0;
    }
    else {
      if (iVar7 != 2) {
        pcVar13 = "0";
        uVar16 = 0x3be;
        goto LAB_00129908;
      }
      if (bVar5 == 0) {
        pcVar13 = "Server expects MASK bit to be set.";
        goto LAB_00129780;
      }
      uVar9 = 4;
    }
    *(ulong *)&self[0x40].stopped.type = uVar9;
    bVar5 = bVar2 & 0xf;
    *(byte *)((long)&self[0x40].stopped.src + 2) = bVar5;
    uVar12 = bVar11 & 0x7f;
    size = (size_t)uVar12;
    bVar11 = (byte)uVar12;
    *(byte *)((long)&self[0x40].stopped.src + 3) = bVar11;
    iVar3 = *(int *)&self[0x41].fn;
    if (iVar3 == 0) {
      if (bVar5 == 0) {
        pcVar13 = "No message to continue.";
        goto LAB_00129780;
      }
      self[0x41].stopped.field_0x1c = bVar2 | 0x80;
    }
    if (0x7d < bVar11) {
      uVar15 = 8;
      if (bVar11 == 0x7e) {
        uVar15 = 2;
      }
      uVar9 = uVar9 | uVar15;
      *(ulong *)&self[0x40].stopped.type = uVar9;
    }
    switch(bVar5) {
    case 0:
      *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 0;
      *(uint *)&self[0x41].fn = bVar2 >> 7 ^ 1;
      bVar4 = true;
      if (bVar11 != 0 || uVar9 != 0) goto LAB_00129805;
      if (iVar7 != 1) {
        pcVar13 = "sws->mode == NN_WS_CLIENT";
        uVar16 = 0x415;
        goto LAB_00129908;
      }
      *(undefined8 *)&self[0x41].stopped.src = 0;
      if (-1 < (char)bVar2) goto LAB_001297d4;
      goto LAB_001294da;
    case 1:
    case 2:
      *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 0;
      if (iVar3 != 0) {
        pcVar13 = "Expected continuation frame opcode.";
        goto LAB_00129780;
      }
      if ((bVar2 & 0x80) == 0) {
        *(undefined4 *)&self[0x41].fn = 1;
      }
      bVar4 = true;
      if (bVar11 == 0 && uVar9 == 0) {
        if (iVar7 == 1) {
          *(undefined8 *)&self[0x41].stopped.src = 0;
          if ((bVar2 & 0x80) == 0) goto LAB_001297d4;
          goto LAB_001294da;
        }
        pcVar13 = "sws->mode == NN_WS_CLIENT";
        uVar16 = 0x3f8;
        goto LAB_00129908;
      }
      goto LAB_00129805;
    default:
      pcVar13 = "Invalid opcode.";
      goto LAB_00129780;
    case 8:
      *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
      if ((bVar2 & 0x80) == 0) goto LAB_00129779;
      if (0x7d < bVar11) goto LAB_0012976c;
      if (bVar11 == 1) {
        pcVar13 = "Expected 2byte close code.";
        goto LAB_00129780;
      }
      goto LAB_001297e3;
    case 9:
      *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
      *(int *)&self[0x41].srcptr = *(int *)&self[0x41].srcptr + 1;
      break;
    case 10:
      *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
      piVar14 = (int *)((long)&self[0x41].srcptr + 4);
      *piVar14 = *piVar14 + 1;
    }
    if (0x7d < bVar11) {
LAB_0012976c:
      pcVar13 = "Control frame payload exceeds allowable length.";
LAB_00129780:
      nn_sws_fail_conn((nn_sws *)self,0x3ea,pcVar13);
      return;
    }
    if ((bVar2 & 0x80) == 0) {
LAB_00129779:
      pcVar13 = "Cannot fragment control message (FIN=0).";
      goto LAB_00129780;
    }
LAB_001297e3:
    if (bVar11 == 0 && uVar9 == 0) {
      *(undefined8 *)&self[0x41].stopped.src = 0;
      goto switchD_00129425_caseD_9;
    }
    bVar4 = false;
LAB_00129805:
    if (uVar9 != 0) {
      *(undefined4 *)&self[0x40].ctx = 2;
      self_00 = (nn_usock *)self[1].srcptr;
      buf = (nn_fsm *)((long)&self[0x40].ctx + 6);
      goto LAB_001295d3;
    }
    if (iVar7 == 1) {
      if (bVar11 < 0x7e) {
        if (bVar11 != 0) {
          *(undefined4 *)&self[0x40].ctx = 3;
          *(size_t *)&self[0x41].stopped.src = size;
          if (bVar4) {
            piVar14 = &self[0x41].stopped.type;
            *piVar14 = *piVar14 + 1;
            ppvVar1 = &self[0x41].stopped.srcptr;
            *ppvVar1 = (void *)((long)*ppvVar1 + size);
            buf = (nn_fsm *)nn_msg_chunk_new(size,(nn_list *)&self[0x41].owner);
            size = *(size_t *)&self[0x41].stopped.src;
          }
          else {
            buf = (nn_fsm *)&self[0x41].stopped.field_0x1d;
          }
          self[0x41].stopped.fsm = buf;
          goto LAB_001295cf;
        }
        pcVar13 = "sws->payload_ctl > 0";
        uVar16 = 0x4a5;
      }
      else {
        pcVar13 = "sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH";
        uVar16 = 0x4a1;
      }
    }
    else {
      pcVar13 = "sws->mode == NN_WS_CLIENT";
      uVar16 = 0x49d;
    }
  }
LAB_00129908:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar13,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
          ,uVar16);
  goto LAB_0012990f;
}

Assistant:

static void nn_sws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;
    int rc;

    sws = nn_cont (self, struct nn_sws, fsm);

    switch (sws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ws_handshake_start (&sws->handshaker, sws->usock,
                    &sws->pipebase, sws->mode, sws->resource, sws->remote_host);
                sws->state = NN_SWS_STATE_HANDSHAKE;
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE state.                                                          */
/******************************************************************************/
    case NN_SWS_STATE_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_OK:

                /*  Before moving to the active state stop the handshake
                    state machine. */
                nn_ws_handshake_stop (&sws->handshaker);
                sws->state = NN_SWS_STATE_STOPPING_HANDSHAKE;
                return;

            case NN_WS_HANDSHAKE_ERROR:

                /* Raise the error and move directly to the DONE state.
                   ws_handshake object will be stopped later on. */
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_HANDSHAKE state.                                                 */
/******************************************************************************/
    case NN_SWS_STATE_STOPPING_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sws->pipebase);
                 if (nn_slow (rc < 0)) {
                    sws->state = NN_SWS_STATE_DONE;
                    nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 nn_sws_recv_hdr (sws);

                 /*  Mark the pipe as available for sending. */
                 sws->outstate = NN_SWS_OUTSTATE_IDLE;

                 sws->state = NN_SWS_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SWS_STATE_ACTIVE:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                nn_msg_term (&sws->outmsg);
                nn_msg_init (&sws->outmsg, 0);
                nn_pipebase_sent (&sws->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sws->instate) {
                case NN_SWS_INSTATE_RECV_HDR:

                    /*  Require RSV1, RSV2, and RSV3 bits to be unset for
                        x-nanomsg protocol as per RFC 6455 section 5.2. */
                    if (sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV1 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV2 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV3) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "RSV1, RSV2, and RSV3 must be unset.");
                        return;
                    }

                    sws->is_final_frame = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_FIN;
                    sws->masked = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_MASKED;

                    switch (sws->mode) {
                    case NN_WS_SERVER:
                        /*  Require mask bit to be set from client. */
                        if (sws->masked) {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = NN_SWS_FRAME_SIZE_MASK;
                            break;
                        }
                        else {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Server expects MASK bit to be set.");
                            return;
                        }
                    case NN_WS_CLIENT:
                        /*  Require mask bit to be unset from server. */
                        if (sws->masked) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Client expects MASK bit to be unset.");
                            return;
                        }
                        else {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = 0;
                            break;
                        }
                    default:
                        /*  Only two modes of this endpoint are expected. */
                        nn_assert (0);
                        return;
                    }

                    sws->opcode = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_OPCODE;
                    sws->payload_ctl = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_LENGTH;

                    /*  Prevent unexpected continuation frame. */
                    if (!sws->continuing &&
                        sws->opcode == NN_WS_OPCODE_FRAGMENT) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "No message to continue.");
                        return;
                    }

                    /*  Preserve initial message opcode and RSV bits in case
                        this is a fragmented message. */
                    if (!sws->continuing)
                        sws->inmsg_hdr = sws->inhdr [0] |
                        NN_SWS_FRAME_BITMASK_FIN;

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
                    }
                    else {
                        /*  Developer error parsing/handling length. */
                        nn_assert (0);
                        return;
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        /*  Fall thru; TEXT and BINARY handled alike. */
                    case NN_WS_OPCODE_BINARY:

                        sws->is_control_frame = 0;

                        if (sws->continuing) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected continuation frame opcode.");
                            return;
                        }

                        if (!sws->is_final_frame)
                            sws->continuing = 1;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                            }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_FRAGMENT:

                        sws->is_control_frame = 0;
                        sws->continuing = !sws->is_final_frame;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PING:
                        sws->is_control_frame = 1;
                        sws->pings_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_PONG:
                        sws->is_control_frame = 1;
                        sws->pongs_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_CLOSE:
                        /*  RFC 6455 section 5.5.1. */
                        sws->is_control_frame = 1;
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }

                        if (sws->payload_ctl == 1) {
                            /*  As per RFC 6455 section 5.5.1, if a payload is
                                to accompany a close frame, the first two bytes
                                MUST be the close code. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected 2byte close code.");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    default:
                        /*  Client sent an invalid opcode; as per RFC 6455
                            section 10.7, close connection with code. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid opcode.");
                        return;

                    }

                    if (sws->ext_hdr_len == 0) {
                        /*  Only a remote server could send a 2-byte msg;
                            sanity-check that this endpoint is a client. */
                        nn_assert (sws->mode == NN_WS_CLIENT);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl > 0);

                        sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                        sws->inmsg_current_chunk_len = sws->payload_ctl;


                        /*  Use scatter/gather array for application messages,
                            and a fixed-width buffer for control messages. This
                            is convenient since control messages can be
                            interspersed between chunked application msgs. */
                        if (sws->is_control_frame) {
                            sws->inmsg_current_chunk_buf = sws->inmsg_control;
                        }
                        else {
                            sws->inmsg_chunks++;
                            sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                            sws->inmsg_current_chunk_buf =
                                nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                                &sws->inmsg_array);
                        }

                        nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, NULL);
                        return;
                    }
                    else {
                        /*  Continue receiving the rest of the header frame. */
                        sws->instate = NN_SWS_INSTATE_RECV_HDREXT;
                        nn_usock_recv (sws->usock,
                            sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL,
                            sws->ext_hdr_len,
                            NULL);
                        return;
                    }

                case NN_SWS_INSTATE_RECV_HDREXT:
                    nn_assert (sws->ext_hdr_len > 0);

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->inmsg_current_chunk_len = sws->payload_ctl;
                        if (sws->masked) {
                            sws->mask = sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->inmsg_current_chunk_len =
                            nn_gets (sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_16;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->inmsg_current_chunk_len =
                            (size_t) nn_getll (sws->inhdr +
                            NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_63;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else {
                        /*  Client sent invalid data; as per RFC 6455,
                            server closes the connection immediately. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid payload length.");
                        return;
                    }

                    /*  Handle zero-length message bodies. */
                    if (sws->inmsg_current_chunk_len == 0)
                    {
                        if (sws->is_final_frame) {
                           if (sws->opcode == NN_WS_OPCODE_CLOSE) {
                             nn_pipebase_stop (&sws->pipebase);
                             sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                            }
                            else
                            { 
                              sws->instate = (sws->is_control_frame ?
                                  NN_SWS_INSTATE_RECVD_CONTROL :
                                  NN_SWS_INSTATE_RECVD_CHUNKED);
                              nn_pipebase_received (&sws->pipebase);
                            }
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
			return;
                    }

                    nn_assert (sws->inmsg_current_chunk_len > 0);

                    /*  Use scatter/gather array for application messages,
                        and a fixed-width buffer for control messages. This
                        is convenient since control messages can be
                        interspersed between chunked application msgs. */
                    if (sws->is_control_frame) {
                        sws->inmsg_current_chunk_buf = sws->inmsg_control;
                    }
                    else {
                        sws->inmsg_chunks++;
                        sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                        sws->inmsg_current_chunk_buf =
                            nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                            &sws->inmsg_array);
                    }

                    sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                    nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                        sws->inmsg_current_chunk_len, NULL);
                    return;

                case NN_SWS_INSTATE_RECV_PAYLOAD:

                    /*  Unmask if necessary. */
                    if (sws->masked) {
                        nn_sws_mask_payload (sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, sws->mask,
                            NN_SWS_FRAME_SIZE_MASK, NULL);
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        nn_sws_validate_utf8_chunk (sws);
                        return;

                    case NN_WS_OPCODE_BINARY:
                        if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_FRAGMENT:
                        /*  Must check original opcode to see if this fragment
                            needs UTF-8 validation. */
                        if ((sws->inmsg_hdr & NN_SWS_FRAME_BITMASK_OPCODE) ==
                            NN_WS_OPCODE_TEXT) {
                            nn_sws_validate_utf8_chunk (sws);
                        }
                        else if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_PING:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_PONG:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_CLOSE:
                        /*  If the payload is not even long enough for the
                            required 2-octet Close Code, the connection
                            should have been failed upstream. */
                        nn_assert (sws->inmsg_current_chunk_len >=
                            NN_SWS_CLOSE_CODE_LEN);
                        
                        nn_pipebase_stop (&sws->pipebase);
                        sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                        return;

                    default:
                        /*  This should have been prevented upstream. */
                        nn_assert (0);
                        return;
                    } 

                default:
                    nn_fsm_error ("Unexpected socket instate",
                        sws->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_BROKEN_CONNECTION;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

            break;

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_CONNECTION state.                                                 */
/*  Wait for acknowledgement closing handshake was successfully sent.         */
/******************************************************************************/
    case NN_SWS_STATE_CLOSING_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  Wait for acknowledgement closing handshake was sent
                    to peer. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SWS_STATE_BROKEN_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SWS_STATE_DONE:
        nn_fsm_bad_source (sws->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sws->state, src, type);
    }
}